

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermConstantUnion * __thiscall
glslang::TIntermediate::addConstantUnion
          (TIntermediate *this,TString *s,TSourceLoc *loc,bool literal)

{
  pointer pTVar1;
  TIntermConstantUnion *pTVar2;
  TIntermediate *this_00;
  TConstUnionArray unionArray;
  TConstUnionArray local_c8;
  
  TConstUnionArray::TConstUnionArray(&local_c8,1);
  pTVar1 = ((local_c8.unionArray)->
           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (pTVar1->field_0).sConst = s;
  pTVar1->type = EbtString;
  this_00 = (TIntermediate *)&stack0xffffffffffffff48;
  TType::TType((TType *)&stack0xffffffffffffff48,EbtString,EvqConst,1,0,0,false);
  pTVar2 = addConstantUnion(this_00,&local_c8,(TType *)&stack0xffffffffffffff48,loc,literal);
  return pTVar2;
}

Assistant:

TIntermConstantUnion* TIntermediate::addConstantUnion(const TString* s, const TSourceLoc& loc, bool literal) const
{
    TConstUnionArray unionArray(1);
    unionArray[0].setSConst(s);

    return addConstantUnion(unionArray, TType(EbtString, EvqConst), loc, literal);
}